

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::UpdateCTestConfiguration(cmCTest *this)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  char cVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  long lVar10;
  mapped_type *pmVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string key;
  string fileName;
  string value;
  string line;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_6f0;
  long *local_6d0;
  long local_6c8;
  long local_6c0 [2];
  string local_6b0;
  string local_690;
  cmCTest *local_670;
  CTestConfigurationMap *local_668;
  string local_660;
  string local_640;
  byte abStack_620 [488];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [6];
  ios_base local_3c8 [911];
  undefined1 local_39;
  
  if (this->SuppressUpdatingCTestConfiguration != false) {
    return true;
  }
  local_6d0 = local_6c0;
  pcVar2 = (this->CTestConfigFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6d0,pcVar2,pcVar2 + (this->CTestConfigFile)._M_string_length);
  if (local_6c8 == 0) {
    pp_Var1 = (_func_int **)(local_438 + 0x10);
    pcVar2 = (this->BinaryDir)._M_dataplus._M_p;
    local_438._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_438,pcVar2,pcVar2 + (this->BinaryDir)._M_string_length);
    std::__cxx11::string::append(local_438);
    std::__cxx11::string::operator=((string *)&local_6d0,(string *)local_438);
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    bVar5 = cmsys::SystemTools::FileExists((char *)local_6d0);
    if (!bVar5) {
      pcVar2 = (this->BinaryDir)._M_dataplus._M_p;
      local_438._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_438,pcVar2,pcVar2 + (this->BinaryDir)._M_string_length);
      std::__cxx11::string::append(local_438);
      std::__cxx11::string::operator=((string *)&local_6d0,(string *)local_438);
      if ((_func_int **)local_438._0_8_ != pp_Var1) {
        operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_438,"UpdateCTestConfiguration  from :",0x20);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_438,(char *)local_6d0,local_6c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__cxx11::stringbuf::str();
  Log(this,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx",
      0x2f7,local_640._M_dataplus._M_p,false);
  paVar12 = &local_640.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != paVar12) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  bVar5 = cmsys::SystemTools::FileExists((char *)local_6d0);
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,"Parse Config file:",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_438,(char *)local_6d0,local_6c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x305,local_640._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != paVar12) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    std::ifstream::ifstream(&local_640,(char *)local_6d0,_S_in);
    if ((abStack_620[*(long *)(local_640._M_dataplus._M_p + -0x18)] & 5) != 0) {
      std::ifstream::~ifstream(&local_640);
LAB_00254247:
      bVar5 = false;
      goto LAB_002547b2;
    }
    local_668 = &this->CTestConfiguration;
    local_670 = this;
    do {
      local_438._0_8_ = local_438._0_8_ & 0xffffffffffffff00;
      cVar3 = (char)&local_640;
      std::ios::widen((char)*(undefined8 *)(local_640._M_dataplus._M_p + -0x18) + cVar3);
      std::istream::getline((char *)&local_640,(long)local_438,-1);
      local_39 = 0;
      local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
      sVar9 = strlen(local_438);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6f0,local_438,local_438 + sVar9);
      CleanString(&local_690,&local_6f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
        operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
      }
      if (local_690._M_string_length != 0) {
        while (((abStack_620[*(long *)(local_640._M_dataplus._M_p + -0x18)] & 5) == 0 &&
               (local_690._M_dataplus._M_p[local_690._M_string_length - 1] == '\\'))) {
          std::__cxx11::string::substr((ulong)&local_6f0,(ulong)&local_690);
          std::__cxx11::string::operator=((string *)&local_690,(string *)&local_6f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
            operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
          }
          local_438._0_8_ = local_438._0_8_ & 0xffffffffffffff00;
          std::ios::widen((char)*(undefined8 *)(local_640._M_dataplus._M_p + -0x18) + cVar3);
          std::istream::getline((char *)&local_640,(long)local_438,-1);
          local_39 = 0;
          local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
          sVar9 = strlen(local_438);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6b0,local_438,local_438 + sVar9);
          CleanString(&local_6f0,&local_6b0);
          std::__cxx11::string::_M_append((char *)&local_690,(ulong)local_6f0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
            operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
            operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((*local_690._M_dataplus._M_p != '#') &&
           (lVar10 = std::__cxx11::string::find_first_of((char *)&local_690,0x586a91,0),
           lVar10 != -1)) {
          std::__cxx11::string::substr((ulong)&local_6f0,(ulong)&local_690);
          std::__cxx11::string::substr((ulong)&local_660,(ulong)&local_690);
          CleanString(&local_6b0,&local_660);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_660._M_dataplus._M_p != &local_660.field_2) {
            operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
          }
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](local_668,&local_6f0);
          std::__cxx11::string::_M_assign((string *)pmVar11);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
            operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
            operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
      }
    } while ((abStack_620[*(long *)(local_640._M_dataplus._M_p + -0x18)] & 5) == 0);
    std::ifstream::close();
    std::ifstream::~ifstream(&local_640);
    this = local_670;
  }
  else if (this->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,"Cannot find file: ",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_438,(char *)local_6d0,local_6c8);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x2fe,local_640._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != paVar12) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    goto LAB_00254247;
  }
  paVar12 = &local_640.field_2;
  local_640._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"BuildDirectory","");
  GetCTestConfiguration((string *)local_438,this,&local_640);
  pp_Var1 = (_func_int **)(local_438 + 0x10);
  if ((_func_int **)local_438._0_8_ != pp_Var1) {
    operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != paVar12) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if (local_438._8_8_ != 0) {
    local_640._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"BuildDirectory","");
    GetCTestConfiguration((string *)local_438,this,&local_640);
    std::__cxx11::string::operator=((string *)&this->BinaryDir,(string *)local_438);
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != paVar12) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ChangeDirectory(&this->BinaryDir);
  }
  local_640._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"TimeOut","");
  GetCTestConfiguration((string *)local_438,this,&local_640);
  uVar4 = local_438._0_8_;
  iVar7 = atoi((char *)local_438._0_8_);
  this->TimeOut = (double)iVar7;
  if ((_func_int **)uVar4 != pp_Var1) {
    operator_delete((void *)uVar4,local_428[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != paVar12) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  bVar5 = true;
  if (this->ProduceXML == true) {
    local_640._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"CompressSubmission","");
    GetCTestConfiguration((string *)local_438,this,&local_640);
    bVar6 = cmSystemTools::IsOn((char *)local_438._0_8_);
    this->CompressXMLFiles = bVar6;
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != paVar12) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002547b2:
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0,local_6c0[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmCTest::UpdateCTestConfiguration()
{
  if ( this->SuppressUpdatingCTestConfiguration )
    {
    return true;
    }
  std::string fileName = this->CTestConfigFile;
  if ( fileName.empty() )
    {
    fileName = this->BinaryDir + "/CTestConfiguration.ini";
    if ( !cmSystemTools::FileExists(fileName.c_str()) )
      {
      fileName = this->BinaryDir + "/DartConfiguration.tcl";
      }
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "UpdateCTestConfiguration  from :"
             << fileName << "\n");
  if ( !cmSystemTools::FileExists(fileName.c_str()) )
    {
    // No need to exit if we are not producing XML
    if ( this->ProduceXML )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot find file: " << fileName
        << std::endl);
      return false;
      }
    }
  else
    {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Parse Config file:"
               << fileName << "\n");
    // parse the dart test file
    cmsys::ifstream fin(fileName.c_str());

    if(!fin)
      {
      return false;
      }

    char buffer[1024];
    while ( fin )
      {
      buffer[0] = 0;
      fin.getline(buffer, 1023);
      buffer[1023] = 0;
      std::string line = cmCTest::CleanString(buffer);
      if(line.empty())
        {
        continue;
        }
      while ( fin && (line[line.size()-1] == '\\') )
        {
        line = line.substr(0, line.size()-1);
        buffer[0] = 0;
        fin.getline(buffer, 1023);
        buffer[1023] = 0;
        line += cmCTest::CleanString(buffer);
        }
      if ( line[0] == '#' )
        {
        continue;
        }
      std::string::size_type cpos = line.find_first_of(":");
      if ( cpos == line.npos )
        {
        continue;
        }
      std::string key = line.substr(0, cpos);
      std::string value
        = cmCTest::CleanString(line.substr(cpos+1, line.npos));
      this->CTestConfiguration[key] = value;
      }
    fin.close();
    }
  if ( !this->GetCTestConfiguration("BuildDirectory").empty() )
    {
    this->BinaryDir = this->GetCTestConfiguration("BuildDirectory");
    cmSystemTools::ChangeDirectory(this->BinaryDir);
    }
  this->TimeOut = atoi(this->GetCTestConfiguration("TimeOut").c_str());
  if ( this->ProduceXML )
    {
    this->CompressXMLFiles = cmSystemTools::IsOn(
      this->GetCTestConfiguration("CompressSubmission").c_str());
    }
  return true;
}